

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__metadata_process_unknown_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_uint8 *pChunkId,ma_uint64 chunkSize,
                    ma_dr_wav_metadata_location location)

{
  ma_bool32 mVar1;
  ma_uint8 *pmVar2;
  ma_uint32 in_ECX;
  size_t in_RDX;
  ma_uint8 *in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  ma_dr_wav_metadata *pMetadata;
  ma_uint64 bytesRead;
  ma_dr_wav_metadata *bytesToRead;
  undefined4 in_stack_ffffffffffffffd8;
  void *local_8;
  
  local_8 = (void *)0x0;
  if (in_ECX == 0) {
    local_8 = (void *)0x0;
  }
  else {
    mVar1 = ma_dr_wav_fourcc_equal(in_RSI,"data");
    if (((mVar1 == 0) && (mVar1 = ma_dr_wav_fourcc_equal(in_RSI,"fmt "), mVar1 == 0)) &&
       (mVar1 = ma_dr_wav_fourcc_equal(in_RSI,"fact"), mVar1 == 0)) {
      if (in_RDI->stage == ma_dr_wav__metadata_parser_stage_count) {
        in_RDI->metadataCount = in_RDI->metadataCount + 1;
        ma_dr_wav__metadata_request_extra_memory_for_stage_2(in_RDI,in_RDX,1);
      }
      else {
        bytesToRead = in_RDI->pMetadata + in_RDI->metadataCursor;
        bytesToRead->type = ma_dr_wav_metadata_type_unknown;
        (bytesToRead->data).smpl.productId = in_ECX;
        (bytesToRead->data).unknown.id[0] = *in_RSI;
        (bytesToRead->data).inst.fineTuneCents = in_RSI[1];
        (bytesToRead->data).inst.gainDecibels = in_RSI[2];
        (bytesToRead->data).inst.lowNote = in_RSI[3];
        (bytesToRead->data).smpl.samplePeriodNanoseconds = (ma_uint32)in_RDX;
        pmVar2 = ma_dr_wav__metadata_get_memory(in_RDI,in_RDX,1);
        (bytesToRead->data).unknown.pData = pmVar2;
        local_8 = (void *)ma_dr_wav__metadata_parser_read
                                    ((ma_dr_wav__metadata_parser *)
                                     CONCAT44(in_ECX,in_stack_ffffffffffffffd8),local_8,
                                     (size_t)bytesToRead,(ma_uint64 *)0x217fbd);
        if (local_8 == (void *)(ulong)(bytesToRead->data).smpl.samplePeriodNanoseconds) {
          in_RDI->metadataCursor = in_RDI->metadataCursor + 1;
        }
      }
    }
    else {
      local_8 = (void *)0x0;
    }
  }
  return (ma_uint64)local_8;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_unknown_chunk(ma_dr_wav__metadata_parser* pParser, const ma_uint8* pChunkId, ma_uint64 chunkSize, ma_dr_wav_metadata_location location)
{
    ma_uint64 bytesRead = 0;
    if (location == ma_dr_wav_metadata_location_invalid) {
        return 0;
    }
    if (ma_dr_wav_fourcc_equal(pChunkId, "data") || ma_dr_wav_fourcc_equal(pChunkId, "fmt ") || ma_dr_wav_fourcc_equal(pChunkId, "fact")) {
        return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
        pParser->metadataCount += 1;
        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)chunkSize, 1);
    } else {
        ma_dr_wav_metadata* pMetadata = &pParser->pMetadata[pParser->metadataCursor];
        pMetadata->type                         = ma_dr_wav_metadata_type_unknown;
        pMetadata->data.unknown.chunkLocation   = location;
        pMetadata->data.unknown.id[0]           = pChunkId[0];
        pMetadata->data.unknown.id[1]           = pChunkId[1];
        pMetadata->data.unknown.id[2]           = pChunkId[2];
        pMetadata->data.unknown.id[3]           = pChunkId[3];
        pMetadata->data.unknown.dataSizeInBytes = (ma_uint32)chunkSize;
        pMetadata->data.unknown.pData           = (ma_uint8 *)ma_dr_wav__metadata_get_memory(pParser, (size_t)chunkSize, 1);
        MA_DR_WAV_ASSERT(pMetadata->data.unknown.pData != NULL);
        bytesRead = ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.unknown.pData, pMetadata->data.unknown.dataSizeInBytes, NULL);
        if (bytesRead == pMetadata->data.unknown.dataSizeInBytes) {
            pParser->metadataCursor += 1;
        } else {
        }
    }
    return bytesRead;
}